

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateGetter
          (string *__return_storage_ptr__,NimBfbsGenerator *this,Type *type,string *offsetval,
          bool element_type)

{
  BaseType local_2cc;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  Enum *local_130;
  Enum *type_enum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string offset;
  BaseType base_type;
  bool element_type_local;
  string *offsetval_local;
  Type *type_local;
  NimBfbsGenerator *this_local;
  
  offset.field_2._M_local_buf[0xf] = element_type;
  if (element_type) {
    local_2cc = reflection::Type::element(type);
  }
  else {
    local_2cc = reflection::Type::base_type(type);
  }
  offset.field_2._8_4_ = local_2cc;
  std::__cxx11::string::string((string *)local_50,(string *)offsetval);
  if ((offset.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator+(&local_70,"self.tab.Pos + ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  switch(offset.field_2._8_4_) {
  case 0xd:
    std::operator+(&local_a0,"self.tab.String(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(__return_storage_ptr__,&local_a0,")");
    std::__cxx11::string::~string((string *)&local_a0);
    break;
  case 0xe:
    GenerateGetter(__return_storage_ptr__,this,type,offsetval,true);
    break;
  case 0xf:
    (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
              ((string *)&type_enum,this,type,(bool)(offset.field_2._M_local_buf[0xf] & 1),false);
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type_enum,
                   "(tab: Vtable(Bytes: self.tab.Bytes, Pos: ");
    std::operator+(&local_e8,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(__return_storage_ptr__,&local_e8,"))");
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&type_enum);
    break;
  case 0x10:
    std::operator+(&local_c8,"self.tab.Union(",offsetval);
    std::operator+(__return_storage_ptr__,&local_c8,")");
    std::__cxx11::string::~string((string *)&local_c8);
    break;
  default:
    local_130 = BaseBfbsGenerator::GetEnum
                          (&this->super_BaseBfbsGenerator,type,
                           (bool)(offset.field_2._M_local_buf[0xf] & 1));
    if (local_130 == (Enum *)0x0) {
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_2b0,this,offset.field_2._8_4_);
      std::operator+(&local_290,"Get[",&local_2b0);
      std::operator+(&local_270,&local_290,"](self.tab, ");
      std::operator+(&local_250,&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(__return_storage_ptr__,&local_250,")");
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    else {
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_210,this,type,(bool)(offset.field_2._M_local_buf[0xf] & 1),false);
      std::operator+(&local_1f0,&local_210,"(");
      std::operator+(&local_1d0,&local_1f0,"Get[");
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_230,this,offset.field_2._8_4_);
      std::operator+(&local_1b0,&local_1d0,&local_230);
      std::operator+(&local_190,&local_1b0,"](self.tab, ");
      std::operator+(&local_170,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_150,&local_170,")");
      std::operator+(__return_storage_ptr__,&local_150,")");
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
    }
  }
  local_a4 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateGetter(const r::Type *type, const std::string &offsetval,
                             bool element_type = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    std::string offset = offsetval;
    if (!element_type) { offset = "self.tab.Pos + " + offset; }
    switch (base_type) {
      case r::String: return "self.tab.String(" + offset + ")";
      case r::Union: return "self.tab.Union(" + offsetval + ")";
      case r::Obj: {
        return GenerateType(type, element_type) +
               "(tab: Vtable(Bytes: self.tab.Bytes, Pos: " + offset + "))";
      }
      case r::Vector: return GenerateGetter(type, offsetval, true);
      default:
        const r::Enum *type_enum = GetEnum(type, element_type);
        if (type_enum != nullptr) {
          return GenerateType(type, element_type) + "(" + "Get[" +
                 GenerateType(base_type) + "](self.tab, " + offset + ")" + ")";
        } else {
          return "Get[" + GenerateType(base_type) + "](self.tab, " + offset +
                 ")";
        }
    }
  }